

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O2

void TTD::NSLogEvents::JsRTByteBufferAction_Emit<(TTD::NSLogEvents::EventKind)39>
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  JsRTByteBufferAction *pJVar1;
  uint32 i;
  ulong uVar2;
  bool bVar3;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTByteBufferAction,(TTD::NSLogEvents::EventKind)39>
                     (evt);
  (*writer->_vptr_FileWriter[3])(writer,0x12,1);
  bVar3 = false;
  NSSnapValues::EmitTTDVar(pJVar1->Result,writer,NoSeparator);
  if (pJVar1->Buffer == (byte *)0x0) {
    bVar3 = pJVar1->Length != 0;
  }
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)bVar3,1);
  FileWriter::WriteLengthValue(writer,pJVar1->Length,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  if (bVar3 == false) {
    for (uVar2 = 0; uVar2 < pJVar1->Length; uVar2 = uVar2 + 1) {
      (*writer->_vptr_FileWriter[0xb])(writer,(ulong)pJVar1->Buffer[uVar2],(ulong)(uVar2 != 0));
    }
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  return;
}

Assistant:

void JsRTByteBufferAction_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const JsRTByteBufferAction* bufferAction = GetInlineEventDataAs<JsRTByteBufferAction, tag>(evt);

            writer->WriteKey(NSTokens::Key::argRetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(bufferAction->Result, writer, NSTokens::Separator::NoSeparator);

            bool badValue = (bufferAction->Buffer == nullptr && bufferAction->Length > 0);
            writer->WriteBool(NSTokens::Key::boolVal, badValue, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(bufferAction->Length, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            if(!badValue)
            {
                for(uint32 i = 0; i < bufferAction->Length; ++i)
                {
                    writer->WriteNakedByte(bufferAction->Buffer[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
                }
            }
            writer->WriteSequenceEnd();
        }